

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gme.cpp
# Opt level: O2

gme_type_t * gme_type_list(void)

{
  int iVar1;
  
  if ((gme_type_list::gme_type_list_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&gme_type_list::gme_type_list_), iVar1 != 0)) {
    gme_type_list::gme_type_list_[0] = &gme_ay_type_;
    gme_type_list::gme_type_list_[1] = &gme_gbs_type_;
    gme_type_list::gme_type_list_[2] = &gme_gym_type_;
    gme_type_list::gme_type_list_[3] = &gme_hes_type_;
    gme_type_list::gme_type_list_[4] = &gme_kss_type_;
    gme_type_list::gme_type_list_[5] = &gme_nsf_type_;
    gme_type_list::gme_type_list_[6] = &gme_nsfe_type_;
    gme_type_list::gme_type_list_[7] = &gme_sap_type_;
    gme_type_list::gme_type_list_[8] = &gme_spc_type_;
    gme_type_list::gme_type_list_[9] = &gme_vgm_type_;
    gme_type_list::gme_type_list_[10] = &gme_vgz_type_;
    gme_type_list::gme_type_list_[0xb] = (gme_type_t)0x0;
    __cxa_guard_release(&gme_type_list::gme_type_list_);
  }
  return gme_type_list::gme_type_list_;
}

Assistant:

BLARGG_EXPORT gme_type_t const* gme_type_list()
{
	static gme_type_t const gme_type_list_ [] = {
#ifdef GME_TYPE_LIST
	GME_TYPE_LIST,
#else
	#ifdef USE_GME_AY
	            gme_ay_type,
	#endif
	#ifdef USE_GME_GBS
	            gme_gbs_type,
	#endif
	#ifdef USE_GME_GYM
	            gme_gym_type,
	#endif
	#ifdef USE_GME_HES
	            gme_hes_type,
	#endif
	#ifdef USE_GME_KSS
	            gme_kss_type,
	#endif
	#ifdef USE_GME_NSF
	            gme_nsf_type,
	#endif
	#ifdef USE_GME_NSFE
	            gme_nsfe_type,
	#endif
	#ifdef USE_GME_SAP
	            gme_sap_type,
	#endif
	#ifdef USE_GME_SPC
	            gme_spc_type,
	#endif
	#ifdef USE_GME_VGM
	            gme_vgm_type,
	            gme_vgz_type,
	#endif
#endif
        0
    };

	return gme_type_list_;
}